

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O0

void __thiscall
ProtocolTCP::Reset(ProtocolTCP *this,InterfaceMAC *mac,uint16_t localPort,uint16_t remotePort,
                  uint8_t *remoteAddress)

{
  ProtocolIPv4 *this_00;
  uint16_t value;
  DataBuffer *buffer_00;
  size_t sVar1;
  uint8_t *sourceIP;
  uint8_t *puVar2;
  DataBuffer *buffer;
  uint16_t length;
  uint16_t checksum;
  uint8_t *packet;
  uint8_t *remoteAddress_local;
  uint16_t remotePort_local;
  uint16_t localPort_local;
  InterfaceMAC *mac_local;
  ProtocolTCP *this_local;
  
  buffer_00 = ProtocolIPv4::GetTxBuffer(this->IP,mac);
  if (buffer_00 != (DataBuffer *)0x0) {
    sVar1 = header_size();
    buffer_00->Packet = buffer_00->Packet + sVar1;
    sVar1 = header_size();
    buffer_00->Remainder = buffer_00->Remainder - (short)sVar1;
    sVar1 = header_size();
    buffer_00->Packet = buffer_00->Packet + -sVar1;
    puVar2 = buffer_00->Packet;
    if (puVar2 != (uint8_t *)0x0) {
      Pack16(puVar2,0,localPort);
      Pack16(puVar2,2,remotePort);
      Pack32(puVar2,4,0);
      Pack32(puVar2,8,0);
      Pack8(puVar2,0xc,'P');
      Pack8(puVar2,0xd,'\x04');
      Pack16(puVar2,0xe,0);
      Pack16(puVar2,0x10,0);
      Pack16(puVar2,0x12,0);
      sVar1 = header_size();
      sourceIP = ProtocolIPv4::GetUnicastAddress(this->IP);
      value = ComputeChecksum(puVar2,(uint16_t)sVar1,sourceIP,remoteAddress);
      Pack16(puVar2,0x10,value);
      sVar1 = header_size();
      buffer_00->Length = buffer_00->Length + (short)sVar1;
      buffer_00->Remainder = buffer_00->Remainder - buffer_00->Length;
      this_00 = this->IP;
      puVar2 = ProtocolIPv4::GetUnicastAddress(this->IP);
      ProtocolIPv4::Transmit(this_00,buffer_00,'\x06',remoteAddress,puVar2);
    }
  }
  return;
}

Assistant:

void ProtocolTCP::Reset(InterfaceMAC* mac,
                        uint16_t localPort,
                        uint16_t remotePort,
                        const uint8_t* remoteAddress)
{
    uint8_t* packet;
    uint16_t checksum;
    uint16_t length;

    DataBuffer* buffer = IP.GetTxBuffer(mac);

    if (buffer == nullptr)
    {
        return;
    }

    buffer->Packet += header_size();
    buffer->Remainder -= header_size();

    buffer->Packet -= header_size();
    packet = buffer->Packet;
    length = buffer->Length;
    if (packet != nullptr)
    {
        Pack16(packet, 0, localPort);
        Pack16(packet, 2, remotePort);
        Pack32(packet, 4, 0);    // Sequence
        Pack32(packet, 8, 0);    // AckSequence
        Pack8(packet, 12, 0x50); // Header length and reserved
        Pack8(packet, 13, FLAG_RST);
        Pack16(packet, 14, 0); // window size
        Pack16(packet, 16, 0); // clear checksum
        Pack16(packet, 18, 0); // 2 bytes of UrgentPointer

        checksum = ProtocolTCP::ComputeChecksum(
            packet, header_size(), IP.GetUnicastAddress(), remoteAddress);

        Pack16(packet, 16, checksum); // checksum

        buffer->Length += header_size();
        buffer->Remainder -= buffer->Length;

        IP.Transmit(buffer, 0x06, remoteAddress, IP.GetUnicastAddress());
    }
}